

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonsugar.hpp
# Opt level: O0

basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__N_,_int>_>,_std::tuple<>,_std::tuple<>_>
* __thiscall
nonsugar::basic_command<std::__cxx11::string,char,std::tuple<>,std::tuple<>,std::tuple<>>::
flag<(char)78,int>(basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__N_,_int>_>,_std::tuple<>,_std::tuple<>_>
                   *__return_storage_ptr__,void *this,initializer_list<char> short_names,
                  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  long_names,
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *placeholder,
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *help,
                  flag_type type)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<char> __l_00;
  flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__N_,_int>
  *t;
  detail *this_00;
  tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__N_,_int>_>
  local_1d8;
  undefined1 local_12b;
  value_read<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_void>
  local_12a;
  undefined1 local_129 [9];
  size_type sStack_120;
  allocator_type local_f9;
  iterator local_f8;
  size_type sStack_f0;
  undefined1 local_e0 [8];
  flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__N_,_int>
  f;
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::tuple<>,_std::tuple<>,_std::tuple<>_>
  *this_local;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  long_names_local;
  initializer_list<char> short_names_local;
  
  sStack_f0 = short_names._M_len;
  local_f8 = short_names._M_array;
  f._160_8_ = this;
  std::allocator<char>::allocator();
  __l_00._M_len = sStack_f0;
  __l_00._M_array = local_f8;
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_e0,__l_00,&local_f9);
  local_12b = 1;
  t = (flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__N_,_int>
       *)local_129;
  local_129._1_8_ = long_names._M_array;
  sStack_120 = long_names._M_len;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)t);
  __l._M_len = sStack_120;
  __l._M_array = (iterator)local_129._1_8_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&f.short_names.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,__l,
           (allocator_type *)t);
  std::__cxx11::string::string
            ((string *)
             &f.long_names.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)placeholder);
  std::__cxx11::string::string((string *)(f.placeholder.field_2._M_local_buf + 8),(string *)help);
  std::shared_ptr<int>::shared_ptr((shared_ptr<int> *)((long)&f.help.field_2 + 8));
  std::function<std::shared_ptr<int>(std::__cxx11::string_const&)>::
  function<nonsugar::value_read<std::__cxx11::string,int,void>,void>
            ((function<std::shared_ptr<int>(std::__cxx11::string_const&)> *)
             &f.default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_12a);
  f.read._M_invoker._0_1_ = type == exclusive;
  local_12b = 0;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_129);
  std::allocator<char>::~allocator(&local_f9);
  this_00 = (detail *)this;
  detail::tuple_append<std::tuple<>,nonsugar::detail::flag<std::__cxx11::string,char,(char)78,int>>
            (&local_1d8,(detail *)((long)this + 0x40),(tuple<> *)local_e0,t);
  detail::
  make_command<std::__cxx11::string,char,std::tuple<nonsugar::detail::flag<std::__cxx11::string,char,(char)78,int>>,std::tuple<>,std::tuple<>>
            (__return_storage_ptr__,this_00,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)this + 0x20),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8,
             (tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__N_,_int>_>
              *)((long)this + 0x41),(tuple<> *)((long)this + 0x42),(tuple<> *)this_00);
  std::
  tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'N',_int>_>
  ::~tuple(&local_1d8);
  detail::
  flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_'N',_int>
  ::~flag((flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__N_,_int>
           *)local_e0);
  return __return_storage_ptr__;
}

Assistant:

auto flag(
        std::initializer_list<char_type> short_names, std::initializer_list<String> long_names,
        String const &placeholder, String const &help, flag_type type = flag_type::normal) const
    {
        detail::flag<String, OptionType, Option, Value> f {
            short_names, long_names, placeholder, help, {},
            value_read<String, typename detail::value_of<String, Value>::type>(),
            type == flag_type::exclusive };
        return detail::make_command<String, OptionType>(
            m_header, m_footer, detail::tuple_append(m_flags, std::move(f)), m_subcommands,
            m_arguments);
    }